

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O2

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_flush
          (sync_basic_ostream<char,_std::char_traits<char>_> *this)

{
  string *psVar1;
  long lVar2;
  int i;
  long lVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> recv_string;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<char,_std::allocator<char>_> strings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  allocator local_99;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<char,_std::allocator<char>_> local_60;
  char *local_48;
  undefined1 *local_40;
  
  std::__cxx11::stringbuf::str();
  local_98[0] = local_40;
  gather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (unsigned_long *)local_98,
             *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18,
             *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  gatherv<char>((vector<char,_std::allocator<char>_> *)&local_60,local_48,(size_t)local_40,
                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18,
                *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  lVar2 = *(long *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8;
  if (*(int *)(lVar2 + 0x14) ==
      *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18) {
    pcVar4 = local_60._M_impl.super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 < *(int *)(lVar2 + 0x10); lVar3 = lVar3 + 1) {
      local_98[0] = local_88;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)local_98,pcVar4,
                 pcVar4 + local_78._M_impl.super__Vector_impl_data._M_start[lVar3]);
      std::operator<<(*(ostream **)
                       &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10,
                      (string *)local_98);
      pcVar4 = pcVar4 + local_78._M_impl.super__Vector_impl_data._M_start[lVar3];
      std::__cxx11::string::~string((string *)local_98);
      lVar2 = *(long *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8;
    }
  }
  psVar1 = *(string **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20;
  std::__cxx11::string::string((string *)local_98,"",&local_99);
  std::__cxx11::stringbuf::str(psVar1);
  std::__cxx11::string::~string((string *)local_98);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void sync_flush() {
        // communicate all data to rank `root`
        std::basic_string<CharT, Traits> str = m_buf->str();
        std::vector<size_t> recv_counts = mxx::gather(str.size(), m_root, m_comm);
        std::vector<CharT> strings = mxx::gatherv(&str[0], str.size(), recv_counts, m_root, m_comm);
        // on `root`: output all strings
        if (m_comm.rank() == m_root) {
            typename std::vector<CharT>::iterator begin = strings.begin();
            for (int i = 0; i < m_comm.size(); ++i) {
                std::basic_string<CharT, Traits> recv_string(begin, begin + recv_counts[i]);
                *m_stream << recv_string;
                begin += recv_counts[i];
            }
        }
        // clear buffer content
        m_buf->str("");
    }